

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRType * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRType>::allocate<spirv_cross::SPIRType>
          (ObjectPool<spirv_cross::SPIRType> *this,SPIRType *p)

{
  Vector<spirv_cross::SPIRType_*> *this_00;
  Dim DVar1;
  uint32_t uVar2;
  ImageFormat IVar3;
  AccessQualifier AVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  undefined2 uVar10;
  uint32_t uVar11;
  bool bVar12;
  undefined1 uVar13;
  _Tuple_impl<0UL,_spirv_cross::SPIRType_*,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
  _Var14;
  size_t sVar15;
  _Head_base<0UL,_spirv_cross::SPIRType_*,_false> _Var16;
  ulong count;
  SPIRType *pSVar17;
  
  this_00 = &this->vacants;
  sVar15 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
  if (sVar15 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var14.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRType_*,_false>)malloc(count * 0x160);
    if (_Var14.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl == (SPIRType *)0x0
       ) {
      return (SPIRType *)0x0;
    }
    SmallVector<spirv_cross::SPIRType_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar15 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
      _Var16._M_head_impl =
           (SPIRType *)_Var14.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRType_*,_0UL>::reserve(this_00,sVar15 + 1);
        sVar15 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.ptr[sVar15] = _Var16._M_head_impl;
        sVar15 = sVar15 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size = sVar15;
        _Var16._M_head_impl = _Var16._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
              .buffer_size + 1);
    sVar15 = (this->memory).
             super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
             .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
    .ptr[sVar15]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRType_*,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRType_*,_false> =
         _Var14.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
    .buffer_size = sVar15 + 1;
    sVar15 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
    pSVar17 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.ptr[sVar15 - 1];
    if (sVar15 == 0) goto LAB_0028d18e;
  }
  else {
    pSVar17 = (this_00->super_VectorView<spirv_cross::SPIRType_*>).ptr[sVar15 - 1];
  }
  SmallVector<spirv_cross::SPIRType_*,_0UL>::resize(this_00,sVar15 - 1);
LAB_0028d18e:
  (pSVar17->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar17->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRType_0048ff28;
  uVar2 = p->width;
  uVar5 = p->vecsize;
  *(undefined8 *)&(pSVar17->super_IVariant).field_0xc =
       *(undefined8 *)&(p->super_IVariant).field_0xc;
  pSVar17->width = uVar2;
  pSVar17->vecsize = uVar5;
  pSVar17->columns = p->columns;
  (pSVar17->array).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar17->array).super_VectorView<unsigned_int>.ptr = (uint *)&(pSVar17->array).stack_storage;
  (pSVar17->array).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar17->array,&p->array);
  (pSVar17->array_size_literal).super_VectorView<bool>.buffer_size = 0;
  (pSVar17->array_size_literal).super_VectorView<bool>.ptr =
       (bool *)&(pSVar17->array_size_literal).stack_storage;
  (pSVar17->array_size_literal).buffer_capacity = 8;
  SmallVector<bool,_8UL>::operator=(&pSVar17->array_size_literal,&p->array_size_literal);
  bVar8 = p->pointer;
  bVar9 = p->forward_pointer;
  uVar10 = *(undefined2 *)&p->field_0x7e;
  uVar2 = (p->cooperative).use_id;
  uVar5 = (p->cooperative).rows_id;
  uVar6 = (p->cooperative).rows_id;
  uVar11 = (p->cooperative).columns_id;
  uVar7 = *(undefined8 *)&(p->cooperative).scope_id;
  pSVar17->pointer_depth = p->pointer_depth;
  pSVar17->pointer = bVar8;
  pSVar17->forward_pointer = bVar9;
  *(undefined2 *)&pSVar17->field_0x7e = uVar10;
  (pSVar17->cooperative).use_id = uVar2;
  (pSVar17->cooperative).rows_id = uVar5;
  (pSVar17->cooperative).rows_id = uVar6;
  (pSVar17->cooperative).columns_id = uVar11;
  *(undefined8 *)&(pSVar17->cooperative).scope_id = uVar7;
  (pSVar17->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
       = 0;
  (pSVar17->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&(pSVar17->member_types).stack_storage;
  (pSVar17->member_types).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
            (&pSVar17->member_types,&p->member_types);
  (pSVar17->member_type_index_redirection).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar17->member_type_index_redirection).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar17->member_type_index_redirection).stack_storage;
  (pSVar17->member_type_index_redirection).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=
            (&pSVar17->member_type_index_redirection,&p->member_type_index_redirection);
  DVar1 = (p->image).dim;
  bVar8 = (p->image).depth;
  bVar9 = (p->image).arrayed;
  bVar12 = (p->image).ms;
  uVar13 = (p->image).field_0xb;
  uVar2 = (p->image).sampled;
  IVar3 = (p->image).format;
  AVar4 = (p->image).access;
  uVar5 = (p->type_alias).id;
  uVar6 = (p->parent_type).id;
  (pSVar17->image).type.id = (p->image).type.id;
  (pSVar17->image).dim = DVar1;
  (pSVar17->image).depth = bVar8;
  (pSVar17->image).arrayed = bVar9;
  (pSVar17->image).ms = bVar12;
  (pSVar17->image).field_0xb = uVar13;
  (pSVar17->image).sampled = uVar2;
  (pSVar17->image).format = IVar3;
  (pSVar17->image).access = AVar4;
  (pSVar17->type_alias).id = uVar5;
  (pSVar17->parent_type).id = uVar6;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(pSVar17->member_name_cache)._M_h,&p->member_name_cache);
  return pSVar17;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}